

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

bool __thiscall
rapidjson::internal::BigInteger::Difference(BigInteger *this,BigInteger *rhs,BigInteger *out)

{
  int iVar1;
  ulong local_58;
  Type d;
  size_t i;
  Type borrow;
  BigInteger *pBStack_38;
  bool ret;
  BigInteger *b;
  BigInteger *a;
  int cmp;
  BigInteger *out_local;
  BigInteger *rhs_local;
  BigInteger *this_local;
  
  iVar1 = Compare(this,rhs);
  if (iVar1 != 0) {
    pBStack_38 = rhs;
    b = this;
    if (iVar1 < 0) {
      pBStack_38 = this;
      b = rhs;
    }
    i = 0;
    for (d = 0; d < b->count_; d = d + 1) {
      local_58 = b->digits_[d] - i;
      if (d < pBStack_38->count_) {
        local_58 = local_58 - pBStack_38->digits_[d];
      }
      i = (size_t)(int)(uint)(b->digits_[d] < local_58);
      out->digits_[d] = local_58;
      if (local_58 != 0) {
        out->count_ = d + 1;
      }
    }
    return iVar1 < 0;
  }
  __assert_fail("cmp != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/biginteger.h"
                ,0xbc,
                "bool rapidjson::internal::BigInteger::Difference(const BigInteger &, BigInteger *) const"
               );
}

Assistant:

bool Difference(const BigInteger& rhs, BigInteger* out) const {
        int cmp = Compare(rhs);
        RAPIDJSON_ASSERT(cmp != 0);
        const BigInteger *a, *b;  // Makes a > b
        bool ret;
        if (cmp < 0) { a = &rhs; b = this; ret = true; }
        else         { a = this; b = &rhs; ret = false; }

        Type borrow = 0;
        for (size_t i = 0; i < a->count_; i++) {
            Type d = a->digits_[i] - borrow;
            if (i < b->count_)
                d -= b->digits_[i];
            borrow = (d > a->digits_[i]) ? 1 : 0;
            out->digits_[i] = d;
            if (d != 0)
                out->count_ = i + 1;
        }

        return ret;
    }